

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O1

void duckdb::PrimitiveColumnWriter::WriteLevels
               (WriteStream *temp_writer,unsafe_vector<uint16_t> *levels,idx_t max_value,
               idx_t offset,idx_t count,optional_idx null_count)

{
  Allocator *allocator_p;
  idx_t iVar1;
  data_ptr_t pdVar2;
  byte bVar3;
  idx_t i;
  MemoryStream intermediate_stream;
  uint local_894;
  WriteStream *local_890;
  optional_idx local_888;
  MemoryStream local_880;
  RleBpEncoder local_850;
  
  if ((count != 0) &&
     ((levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (max_value == 0) {
      local_850.bit_width = 0;
    }
    else {
      bVar3 = 0;
      do {
        bVar3 = bVar3 + 1;
      } while (max_value >> (bVar3 & 0x3f) != 0);
      local_850.bit_width = (uint32_t)bVar3;
    }
    local_850.byte_width = local_850.bit_width + 7 >> 3;
    local_890 = temp_writer;
    local_888.index = null_count.index;
    switchD_01306cb1::default(local_850.bp_block,0,0x800);
    allocator_p = Allocator::DefaultAllocator();
    MemoryStream::MemoryStream(&local_880,allocator_p,0x200);
    local_850.rle_count = 0;
    local_850.bp_block_count = 0;
    if ((local_888.index == 0xffffffffffffffff) ||
       (iVar1 = optional_idx::GetIndex(&local_888), iVar1 != 0)) {
      if (offset < count + offset) {
        do {
          local_894 = (uint)(levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start[offset];
          RleBpEncoder::WriteValue(&local_850,&local_880.super_WriteStream,&local_894);
          offset = offset + 1;
          count = count - 1;
        } while (count != 0);
      }
    }
    else {
      RleBpEncoder::WriteMany
                (&local_850,&local_880.super_WriteStream,
                 (uint)*(levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,count);
    }
    RleBpEncoder::WriteRun(&local_850,&local_880.super_WriteStream);
    iVar1 = MemoryStream::GetPosition(&local_880);
    local_894 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(iVar1);
    (**local_890->_vptr_WriteStream)(local_890,&local_894,4);
    pdVar2 = MemoryStream::GetData(&local_880);
    iVar1 = MemoryStream::GetPosition(&local_880);
    (**local_890->_vptr_WriteStream)(local_890,pdVar2,iVar1);
    MemoryStream::~MemoryStream(&local_880);
  }
  return;
}

Assistant:

void PrimitiveColumnWriter::WriteLevels(WriteStream &temp_writer, const unsafe_vector<uint16_t> &levels,
                                        idx_t max_value, idx_t offset, idx_t count, optional_idx null_count) {
	if (levels.empty() || count == 0) {
		return;
	}

	// write the levels using the RLE-BP encoding
	const auto bit_width = RleBpDecoder::ComputeBitWidth((max_value));
	RleBpEncoder rle_encoder(bit_width);

	// have to write to an intermediate stream first because we need to know the size
	MemoryStream intermediate_stream(Allocator::DefaultAllocator());

	rle_encoder.BeginWrite();
	if (null_count.IsValid() && null_count.GetIndex() == 0) {
		// Fast path: no nulls
		rle_encoder.WriteMany(intermediate_stream, levels[0], count);
	} else {
		for (idx_t i = offset; i < offset + count; i++) {
			rle_encoder.WriteValue(intermediate_stream, levels[i]);
		}
	}
	rle_encoder.FinishWrite(intermediate_stream);

	// start off by writing the byte count as a uint32_t
	temp_writer.Write(NumericCast<uint32_t>(intermediate_stream.GetPosition()));
	// copy over the written data
	temp_writer.WriteData(intermediate_stream.GetData(), intermediate_stream.GetPosition());
}